

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::record_graphics_pipeline
          (StateRecorder *this,VkPipeline pipeline,VkGraphicsPipelineCreateInfo *create_info,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,Hash custom_hash,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  mutex *pmVar6;
  VkGraphicsPipelineCreateInfo *new_info;
  WorkItem local_50;
  
  piVar3 = (int *)create_info->pNext;
  for (piVar4 = piVar3; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
    if (*piVar4 == 0x3ba228ba) goto LAB_0015dd90;
  }
  piVar4 = (int *)0x0;
LAB_0015dd90:
  if ((piVar4 == (int *)0x0) || (bVar1 = true, piVar4[4] == 0)) {
    for (; piVar3 != (int *)0x0; piVar3 = *(int **)(piVar3 + 2)) {
      if (*piVar3 == 0x3b9fac02) goto LAB_0015ddc7;
    }
    piVar3 = (int *)0x0;
LAB_0015ddc7:
    if ((((piVar3 == (int *)0x0) || ((create_info->flags & 0x800) == 0)) ||
        ((*(byte *)(piVar3 + 4) & 6) != 0)) && ((ulong)create_info->stageCount != 0)) {
      uVar5 = 0;
      do {
        if (create_info->pStages[uVar5].module == (VkShaderModule)0x0) {
          for (piVar3 = (int *)create_info->pStages[uVar5].pNext; piVar3 != (int *)0x0;
              piVar3 = *(int **)(piVar3 + 2)) {
            if (*piVar3 == 0x10) goto LAB_0015de28;
          }
          piVar3 = (int *)0x0;
LAB_0015de28:
          if ((piVar3 == (int *)0x0) && (this->impl->should_record_identifier_only == false)) {
            pmVar6 = &this->impl->record_lock;
            iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar6);
            if (iVar2 != 0) goto LAB_0015df48;
            if (pipeline != (VkPipeline)0x0) {
              Impl::push_unregister_locked<VkPipeline_T*>
                        (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
            }
            pthread_mutex_unlock((pthread_mutex_t *)pmVar6);
            goto LAB_0015defd;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != create_info->stageCount);
    }
    pmVar6 = &this->impl->record_lock;
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)pmVar6);
    if (iVar2 != 0) {
LAB_0015df48:
      std::__throw_system_error(iVar2);
    }
    new_info = (VkGraphicsPipelineCreateInfo *)0x0;
    bVar1 = Impl::copy_graphics_pipeline
                      (this->impl,create_info,&this->impl->temp_allocator,base_pipelines,
                       base_pipeline_count,device,gsmcii,&new_info);
    if (bVar1) {
      local_50.type = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
      local_50.create_info = new_info;
      local_50.handle = (uint64_t)pipeline;
      local_50.custom_hash = custom_hash;
      Impl::push_work_locked(this->impl,&local_50);
    }
    else if (pipeline != (VkPipeline)0x0) {
      Impl::push_unregister_locked<VkPipeline_T*>
                (this->impl,VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,pipeline);
    }
    pthread_mutex_unlock((pthread_mutex_t *)pmVar6);
    if (bVar1) {
      Impl::pump_synchronized_recording(this->impl,this);
LAB_0015defd:
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool StateRecorder::record_graphics_pipeline(VkPipeline pipeline, const VkGraphicsPipelineCreateInfo &create_info,
                                             const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                             Hash custom_hash,
                                             VkDevice device,
                                             PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii)
{
	// Silently ignore if we have pipeline binaries.
	// We have no way of recording these unless we go the extra mile to
	// override the global key and add extra metadata blocks.
	// Hopefully applications are well-behaved ...
	auto *binaries = find_pnext<VkPipelineBinaryInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_BINARY_INFO_KHR, create_info.pNext);
	if (binaries && binaries->binaryCount)
		return true;

	// Ignore pipelines that cannot result in meaningful replay.
	// We are not allowed to look at pStages unless we're emitting pre-raster / fragment shader interface.
	// If we are using module identifier data + on use, we need to push it for record.
	auto state_flags = graphics_pipeline_get_effective_state_flags(create_info);
	if (graphics_pipeline_library_state_flags_have_module_state(state_flags))
	{
		for (uint32_t i = 0; i < create_info.stageCount; i++)
		{
			if (shader_stage_is_identifier_only(create_info.pStages[i]) &&
			    !impl->should_record_identifier_only)
			{
				// Have to forget any reference if this API handle is recycled.
				std::lock_guard<std::mutex> lock(impl->record_lock);
				if (pipeline != VK_NULL_HANDLE)
					impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
				return true;
			}
		}
	}

	{
		std::lock_guard<std::mutex> lock(impl->record_lock);

		VkGraphicsPipelineCreateInfo *new_info = nullptr;
		if (!impl->copy_graphics_pipeline(&create_info, impl->temp_allocator,
		                                  base_pipelines, base_pipeline_count,
		                                  device, gsmcii,
		                                  &new_info))
		{
			// Have to forget any reference if this API handle is recycled.
			if (pipeline != VK_NULL_HANDLE)
				impl->push_unregister_locked(VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, pipeline);
			return false;
		}

		impl->push_work_locked({VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO, api_object_cast<uint64_t>(pipeline),
		                        new_info, custom_hash});
	}

	impl->pump_synchronized_recording(this);
	return true;
}